

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int fftrec(char *card,int *status)

{
  size_t sVar1;
  int *in_RSI;
  char *in_RDI;
  char msg [81];
  size_t maxchr;
  size_t ii;
  char local_88 [80];
  undefined1 local_38;
  size_t local_28;
  ulong local_20;
  int *local_18;
  char *local_10;
  int local_4;
  
  if (*in_RSI < 1) {
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_28 = strlen(in_RDI);
    for (local_20 = 8; local_20 < local_28; local_20 = local_20 + 1) {
      if ((local_10[local_20] < ' ') || ('~' < local_10[local_20])) {
        snprintf(local_88,0x51,"Character %d in this keyword is illegal. Hex Value = %X",
                 (ulong)((int)local_20 + 1),(ulong)(uint)(int)local_10[local_20]);
        if (local_10[local_20] == '\0') {
          sVar1 = strlen(local_88);
          strncat(local_88," (NULL char.)",0x50 - sVar1);
        }
        else if (local_10[local_20] == '\t') {
          sVar1 = strlen(local_88);
          strncat(local_88," (TAB char.)",0x50 - sVar1);
        }
        else if (local_10[local_20] == '\n') {
          sVar1 = strlen(local_88);
          strncat(local_88," (Line Feed char.)",0x50 - sVar1);
        }
        else if (local_10[local_20] == '\v') {
          sVar1 = strlen(local_88);
          strncat(local_88," (Vertical Tab)",0x50 - sVar1);
        }
        else if (local_10[local_20] == '\f') {
          sVar1 = strlen(local_88);
          strncat(local_88," (Form Feed char.)",0x50 - sVar1);
        }
        else if (local_10[local_20] == '\r') {
          sVar1 = strlen(local_88);
          strncat(local_88," (Carriage Return)",0x50 - sVar1);
        }
        else if (local_10[local_20] == '\x1b') {
          sVar1 = strlen(local_88);
          strncat(local_88," (Escape char.)",0x50 - sVar1);
        }
        else if (local_10[local_20] == '\x7f') {
          sVar1 = strlen(local_88);
          strncat(local_88," (Delete char.)",0x50 - sVar1);
        }
        ffpmsg((char *)0x179a58);
        strncpy(local_88,local_10,0x50);
        local_38 = 0;
        ffpmsg((char *)0x179a81);
        *local_18 = 0xcf;
        return 0xcf;
      }
    }
    local_4 = *local_18;
  }
  else {
    local_4 = *in_RSI;
  }
  return local_4;
}

Assistant:

int fftrec(char *card,       /* I -  keyword card to test */
           int *status)      /* IO - error status */
/*
  Test that the keyword card conforms to the FITS standard.  Must contain
  only printable ASCII characters;
*/
{
    size_t ii, maxchr;
    char msg[FLEN_ERRMSG];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    maxchr = strlen(card);

    for (ii = 8; ii < maxchr; ii++)
    {
        if (card[ii] < 32 || card[ii] > 126)
        {
            snprintf(msg, FLEN_ERRMSG, 
           "Character %d in this keyword is illegal. Hex Value = %X",
              (int) (ii+1), (int) card[ii] );

            if (card[ii] == 0)
	        strncat(msg, " (NULL char.)",FLEN_ERRMSG-strlen(msg)-1);
            else if (card[ii] == 9)
	        strncat(msg, " (TAB char.)",FLEN_ERRMSG-strlen(msg)-1);
            else if (card[ii] == 10)
	        strncat(msg, " (Line Feed char.)",FLEN_ERRMSG-strlen(msg)-1);
            else if (card[ii] == 11)
	        strncat(msg, " (Vertical Tab)",FLEN_ERRMSG-strlen(msg)-1);
            else if (card[ii] == 12)
	        strncat(msg, " (Form Feed char.)",FLEN_ERRMSG-strlen(msg)-1);
            else if (card[ii] == 13)
	        strncat(msg, " (Carriage Return)",FLEN_ERRMSG-strlen(msg)-1);
            else if (card[ii] == 27)
	        strncat(msg, " (Escape char.)",FLEN_ERRMSG-strlen(msg)-1);
            else if (card[ii] == 127)
	        strncat(msg, " (Delete char.)",FLEN_ERRMSG-strlen(msg)-1);

            ffpmsg(msg);

            strncpy(msg, card, 80);
            msg[80] = '\0';
            ffpmsg(msg);
            return(*status = BAD_KEYCHAR);        
        }
    }
    return(*status);        
}